

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

int secp256k1_fe_impl_cmp_var(secp256k1_fe *a,secp256k1_fe *b)

{
  int i;
  secp256k1_fe *b_local;
  secp256k1_fe *a_local;
  
  i = 4;
  while( true ) {
    if (i < 0) {
      return 0;
    }
    if (b->n[i] < a->n[i]) break;
    if (a->n[i] < b->n[i]) {
      return -1;
    }
    i = i + -1;
  }
  return 1;
}

Assistant:

static int secp256k1_fe_impl_cmp_var(const secp256k1_fe *a, const secp256k1_fe *b) {
    int i;
    for (i = 4; i >= 0; i--) {
        if (a->n[i] > b->n[i]) {
            return 1;
        }
        if (a->n[i] < b->n[i]) {
            return -1;
        }
    }
    return 0;
}